

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Command * __thiscall Command::execute(Command *this)

{
  bool bVar1;
  int iVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  reference pvVar5;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  allocator<char> local_429;
  string local_428 [32];
  string local_408;
  string local_3e8;
  int local_3c4;
  stringstream local_3c0 [4];
  int x_2;
  stringstream a_1;
  int local_234;
  int x_1;
  int x;
  stringstream a;
  string local_a8 [8];
  string b;
  allocator<char> local_71;
  string local_70 [32];
  reference local_50;
  string *arg_1;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string *arg;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  Command *this_local;
  
  bVar1 = std::operator==(&this->name,"p");
  if (bVar1) {
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->args);
    arg = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->args);
    while (bVar1 = __gnu_cxx::
                   operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&arg), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&__end2);
      log(__x);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  else {
    bVar1 = std::operator==(&this->name,"l");
    if (bVar1) {
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->args);
      arg_1 = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&this->args);
      while (bVar1 = __gnu_cxx::
                     operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&arg_1), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_50 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end3);
        log(__x_00);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_70,"\n",&local_71);
      log(__x_01);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator(&local_71);
    }
    else {
      bVar1 = std::operator==(&this->name,"i");
      if (bVar1) {
        std::__cxx11::string::string(local_a8);
        std::operator>>((istream *)&std::cin,local_a8);
        _Var3 = std::operator|(_S_out,_S_in);
        std::__cxx11::stringstream::stringstream((stringstream *)&x_1,local_a8,_Var3);
        std::istream::operator>>((istream *)&x_1,&local_234);
        pushStack(this,local_234);
        std::__cxx11::stringstream::~stringstream((stringstream *)&x_1);
        std::__cxx11::string::~string(local_a8);
      }
      else {
        bVar1 = std::operator==(&this->name,"s");
        if (bVar1) {
          iVar4 = popStack(this);
          iVar2 = popStack(this);
          pushStack(this,iVar4 - iVar2);
        }
        else {
          bVar1 = std::operator==(&this->name,"a");
          if (bVar1) {
            iVar4 = popStack(this);
            iVar2 = popStack(this);
            pushStack(this,iVar4 + iVar2);
          }
          else {
            bVar1 = std::operator==(&this->name,"d");
            if (bVar1) {
              iVar4 = popStack(this);
              iVar2 = popStack(this);
              pushStack(this,iVar4 / iVar2);
            }
            else {
              bVar1 = std::operator==(&this->name,"m");
              if (bVar1) {
                iVar4 = popStack(this);
                iVar2 = popStack(this);
                pushStack(this,iVar4 * iVar2);
              }
              else {
                bVar1 = std::operator==(&this->name,"b");
                if (bVar1) {
                  iVar4 = popStack(this);
                  pushStack(this,iVar4);
                  pushStack(this,iVar4);
                }
                else {
                  bVar1 = std::operator==(&this->name,"t");
                  if (bVar1) {
                    pvVar5 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[](&this->args,0);
                    _Var3 = std::operator|(_S_out,_S_in);
                    std::__cxx11::stringstream::stringstream(local_3c0,(string *)pvVar5,_Var3);
                    std::istream::operator>>((istream *)local_3c0,&local_3c4);
                    pushStack(this,local_3c4);
                    std::__cxx11::stringstream::~stringstream(local_3c0);
                  }
                  else {
                    bVar1 = std::operator==(&this->name,"P");
                    if (bVar1) {
                      iVar4 = popStack(this);
                      std::__cxx11::to_string(&local_3e8,iVar4);
                      log(__x_02);
                      std::__cxx11::string::~string((string *)&local_3e8);
                    }
                    else {
                      bVar1 = std::operator==(&this->name,"L");
                      if (bVar1) {
                        iVar4 = popStack(this);
                        std::__cxx11::to_string(&local_408,iVar4);
                        log(__x_03);
                        std::__cxx11::string::~string((string *)&local_408);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  (local_428,"\n",&local_429);
                        log(__x_04);
                        std::__cxx11::string::~string(local_428);
                        std::allocator<char>::~allocator(&local_429);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return this;
}

Assistant:

Command& execute() {
            if (name == "p")
                for (const string& arg : args) log(arg);
            else if (name == "l") {
                for (const string& arg : args) log(arg);
                log("\n");
            }
            else if (name == "i") {
                string b;
                cin >> b;
                stringstream a(b);
                int x;
                a >> x;
                pushStack(x);
            } else if (name == "s")
                pushStack(popStack() - popStack());
            else if (name == "a")
                pushStack(popStack() + popStack());
            else if (name == "d")
                pushStack(popStack() / popStack());
            else if (name == "m")
                pushStack(popStack() * popStack());
            else if (name == "b") {
                int x = popStack();
                pushStack(x);
                pushStack(x);
            }
            else if (name == "t") {
                stringstream a(args[0]);
                int x;
                a >> x;
                pushStack(x);
            } else if (name == "P")
                log(to_string(popStack()));
            else if (name == "L") {
                log(to_string(popStack()));
                log("\n");
            }
            return *this;
        }